

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cVertexAttrib64BitTest.cpp
# Opt level: O0

IterateResult __thiscall VertexAttrib64Bit::VAOTest::iterate(VAOTest *this)

{
  bool bVar1;
  GLenum err;
  IterateResult IVar2;
  int local_28;
  bool zero_vertex_attrib_divisor;
  int n_vertex_attrib_divisor;
  bool instanced_draw_call;
  int n_instanced_draw_call;
  _draw_call_type draw_call;
  int n_draw_call_type;
  bool result;
  VAOTest *this_local;
  
  Base::IterateStart(&this->super_Base);
  draw_call._3_1_ = 1;
  Base::RequireExtension(&this->super_Base,"GL_ARB_vertex_attrib_64bit");
  initBuffers(this);
  initBufferObjects(this);
  initProgramObject(this);
  initVAO(this);
  (*(this->super_Base).gl.useProgram)(this->m_po_id);
  err = (*(this->super_Base).gl.getError)();
  glu::checkError(err,"glUseProgram() call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cVertexAttrib64BitTest.cpp"
                  ,0xed3);
  for (n_instanced_draw_call = 0; n_instanced_draw_call < 2;
      n_instanced_draw_call = n_instanced_draw_call + 1) {
    for (n_vertex_attrib_divisor = 0; n_vertex_attrib_divisor < 2;
        n_vertex_attrib_divisor = n_vertex_attrib_divisor + 1) {
      for (local_28 = 0; local_28 < 2; local_28 = local_28 + 1) {
        bVar1 = executeTest(this,n_instanced_draw_call,n_vertex_attrib_divisor == 1,local_28 == 0);
        draw_call._3_1_ = (draw_call._3_1_ & bVar1) != DRAW_CALL_TYPE_ARRAYS >> 0x18;
      }
    }
  }
  IVar2 = Base::IterateStop(&this->super_Base,(bool)draw_call._3_1_);
  return IVar2;
}

Assistant:

tcu::TestNode::IterateResult VAOTest::iterate()
{
	IterateStart();

	bool result = true;

	RequireExtension("GL_ARB_vertex_attrib_64bit");

	/* Initialize GL objects required to run the test */
	initBuffers();
	initBufferObjects();
	initProgramObject();
	initVAO();

	/* Activate the program object before we continue */
	gl.useProgram(m_po_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glUseProgram() call failed.");

	/* Iterate through all draw call combinations */
	for (int n_draw_call_type = 0; n_draw_call_type < DRAW_CALL_TYPE_COUNT; ++n_draw_call_type)
	{
		_draw_call_type draw_call = (_draw_call_type)n_draw_call_type;

		for (int n_instanced_draw_call = 0; n_instanced_draw_call <= 1; /* false & true */
			 ++n_instanced_draw_call)
		{
			bool instanced_draw_call = (n_instanced_draw_call == 1);

			for (int n_vertex_attrib_divisor = 0; n_vertex_attrib_divisor <= 1; /* 0 & non-zero divisor */
				 ++n_vertex_attrib_divisor)
			{
				bool zero_vertex_attrib_divisor = (n_vertex_attrib_divisor == 0);

				/* Execute the test */
				result &= executeTest(draw_call, instanced_draw_call, zero_vertex_attrib_divisor);
			} /* for (two vertex attrib divisor configurations) */
		}	 /* for (non-instanced & instanced draw calls) */
	}		  /* for (array-based & indiced draw calls) */

	/* Done */
	return IterateStop(result);
}